

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hatetarget.cpp
# Opt level: O0

void __thiscall AHateTarget::BeginPlay(AHateTarget *this)

{
  AHateTarget *this_local;
  
  AActor::BeginPlay(&this->super_AActor);
  if ((this->super_AActor).SpawnAngle == 0) {
    (this->super_AActor).special2 = 1;
    (this->super_AActor).health = 0xf4241;
  }
  else {
    (this->super_AActor).health = (uint)(this->super_AActor).SpawnAngle * 10;
  }
  return;
}

Assistant:

void AHateTarget::BeginPlay()
{
	Super::BeginPlay();
	if (SpawnAngle != 0)
	{	// Each degree translates into 10 units of health
		health = SpawnAngle * 10;
	}
	else
	{
		special2 = 1;
		health = 1000001;
	}
}